

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

void mqtt_recv_consume(Curl_easy *data,size_t nbytes)

{
  void *pvVar1;
  size_t sVar2;
  dynbuf *s;
  
  pvVar1 = Curl_meta_get(data,"meta:proto:mqtt:easy");
  if (pvVar1 == (void *)0x0) {
    return;
  }
  s = (dynbuf *)((long)pvVar1 + 0x20);
  sVar2 = Curl_dyn_len(s);
  if (nbytes <= sVar2 && sVar2 - nbytes != 0) {
    Curl_dyn_tail(s,sVar2 - nbytes);
    return;
  }
  Curl_dyn_reset(s);
  return;
}

Assistant:

static void mqtt_recv_consume(struct Curl_easy *data, size_t nbytes)
{
  struct MQTT *mq = Curl_meta_get(data, CURL_META_MQTT_EASY);
  DEBUGASSERT(mq);
  if(mq) {
    size_t rlen = Curl_dyn_len(&mq->recvbuf);
    if(rlen <= nbytes)
      Curl_dyn_reset(&mq->recvbuf);
    else
      Curl_dyn_tail(&mq->recvbuf, rlen - nbytes);
  }
}